

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_file_reader.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  ostream *poVar2;
  Reader *__p;
  shared_ptr<diffusion::Reader> file_reader;
  vector<char,_std::allocator<char>_> line;
  allocator<char> local_41;
  long *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  string local_30;
  
  if (argc < 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," diffusion_file");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,argv[1],&local_41);
    __p = diffusion::create_file_reader(&local_30);
    std::__shared_ptr<diffusion::Reader,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<diffusion::Reader,void>
              ((__shared_ptr<diffusion::Reader,(__gnu_cxx::_Lock_policy)2> *)&local_40,__p);
    std::__cxx11::string::~string((string *)&local_30);
    while( true ) {
      cVar1 = (**(code **)*local_40)();
      if (cVar1 == '\0') break;
      (**(code **)(*local_40 + 8))(&local_30);
      std::ostream::write((char *)&std::cout,(long)local_30._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&local_30);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
    if (argc < 2) {
        std::cerr << "Usage: " << argv[0] << " diffusion_file" << std::endl;
        return 0;
    }
    auto file_reader = std::shared_ptr<diffusion::Reader>(diffusion::create_file_reader(argv[1]));
    while (file_reader->can_read()) {
        auto line = file_reader->read();
        std::cout.write(line.data(), line.size());
        std::cout << std::endl;
    }
    return 0;
}